

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc.c
# Opt level: O1

void duckdb_je_sc_data_update_slab_size(sc_data_t *data,size_t begin,size_t end,int pgs)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  
  iVar1 = data->nsizes;
  if (0 < (long)iVar1) {
    lVar6 = 0;
    do {
      if ((&data->sc[0].bin)[lVar6] != true) {
        return;
      }
      uVar5 = ((long)*(int *)((long)&data->sc[0].ndelta + lVar6) <<
              (*(byte *)((long)&data->sc[0].lg_delta + lVar6) & 0x3f)) +
              (1L << (*(byte *)((long)&data->sc[0].lg_base + lVar6) & 0x3f));
      if (uVar5 <= end && begin <= uVar5) {
        uVar3 = ((uVar5 >> 0xc) + 1) - (ulong)((uVar5 & 0xfff) == 0);
        iVar4 = (int)(uVar5 >> 3);
        if ((ulong)(long)pgs <= (uVar5 >> 3 & 0xfffffffffffff)) {
          iVar4 = pgs;
        }
        iVar2 = (int)uVar3;
        if (uVar3 <= (ulong)(long)pgs) {
          iVar2 = iVar4;
        }
        *(int *)((long)&data->sc[0].pgs + lVar6) = iVar2;
      }
      lVar6 = lVar6 + 0x1c;
    } while ((long)iVar1 * 0x1c != lVar6);
  }
  return;
}

Assistant:

void
sc_data_update_slab_size(sc_data_t *data, size_t begin, size_t end, int pgs) {
	assert(data->initialized);
	for (int i = 0; i < data->nsizes; i++) {
		sc_t *sc = &data->sc[i];
		if (!sc->bin) {
			break;
		}
		size_t reg_size = reg_size_compute(sc->lg_base, sc->lg_delta,
		    sc->ndelta);
		if (begin <= reg_size && reg_size <= end) {
			sc_data_update_sc_slab_size(sc, reg_size, pgs);
		}
	}
}